

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_zip.cpp
# Opt level: O2

void __thiscall FZipLump::SetLumpAddress(FZipLump *this)

{
  BYTE *pBVar1;
  FileReader *pFVar2;
  FZipLocalFileHeader localHeader;
  
  pFVar2 = ((this->super_FResourceLump).Owner)->Reader;
  (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar2,(long)this->Position,0);
  (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,&localHeader,0x1e);
  this->Position =
       this->Position + (uint)localHeader.ExtraLength + (uint)localHeader.NameLength + 0x1e;
  pBVar1 = &(this->super_FResourceLump).Flags;
  *pBVar1 = *pBVar1 & 0x7f;
  return;
}

Assistant:

void FZipLump::SetLumpAddress()
{
	// This file is inside a zip and has not been opened before.
	// Position points to the start of the local file header, which we must
	// read and skip so that we can get to the actual file data.
	FZipLocalFileHeader localHeader;
	int skiplen;

	FileReader *file = Owner->Reader;

	file->Seek(Position, SEEK_SET);
	file->Read(&localHeader, sizeof(localHeader));
	skiplen = LittleShort(localHeader.NameLength) + LittleShort(localHeader.ExtraLength);
	Position += sizeof(localHeader) + skiplen;
	Flags &= ~LUMPFZIP_NEEDFILESTART;
}